

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireAnalyzerResults.cpp
# Opt level: O3

void __thiscall
OneWireAnalyzerResults::GenerateBubbleText
          (OneWireAnalyzerResults *this,U64 frame_index,Channel *param_2,DisplayBase display_base)

{
  char *pcVar1;
  Frame frame;
  char number_str [128];
  Frame local_c0 [16];
  ulonglong local_b0;
  undefined1 local_a0;
  byte local_9f;
  char local_98 [128];
  
  AnalyzerResults::GetFrame((ulonglong)local_c0);
  AnalyzerResults::ClearResultStrings();
  AnalyzerHelpers::GetNumberString(local_b0,display_base,8,local_98,0x80);
  switch(local_a0) {
  case 0:
    if ((local_9f & 0x40) == 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"R",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"RESET",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      pcVar1 = "RESET condition";
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,"R!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"RESET - WARNING",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"RESET - warning, too short.",(char *)0x0,(char *)0x0,(char *)0x0,
                 (char *)0x0);
      pcVar1 = "RESET - warning, pulse shorter than 480us";
    }
    goto LAB_00106e8a;
  case 1:
    AnalyzerResults::AddResultString
              ((char *)this,"P",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"PRESENCE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar1 = "PRESENCE condition";
    goto LAB_00106e8a;
  case 2:
    AnalyzerResults::AddResultString
              ((char *)this,"READ",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"READ ROM COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar1 = "READ ROM command: [";
    break;
  case 3:
    AnalyzerResults::AddResultString
              ((char *)this,"SKIP",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SKIP ROM COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar1 = "SKIP ROM command: [";
    break;
  case 4:
    AnalyzerResults::AddResultString
              ((char *)this,"SEARCH",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SEARCH ROM COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar1 = "SEARCH ROM command: [";
    break;
  case 5:
    AnalyzerResults::AddResultString
              ((char *)this,"MATCH",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"MATCH ROM COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar1 = "MATCH ROM command: [";
    break;
  case 6:
    AnalyzerResults::AddResultString
              ((char *)this,"OD SKIP",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"OVERDRIVE SKIP ROM",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar1 = "OVERDRIVE SKIP ROM command: [";
    break;
  case 7:
    AnalyzerResults::AddResultString
              ((char *)this,"OD MATCH",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"OVERDRIVE MATCH COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar1 = "OVERDRIVE MATCH ROM command: [";
    break;
  case 8:
    AnalyzerResults::AddResultString
              ((char *)this,"CRC",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString((char *)this,"CRC: [",local_98,"]",(char *)0x0,(char *)0x0);
    pcVar1 = "CRC section from ROM: [";
    break;
  case 9:
    AnalyzerResults::AddResultString
              ((char *)this,"FAMILY",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString((char *)this,"FAMILY: [",local_98,"]",(char *)0x0,(char *)0x0);
    pcVar1 = "FAMILY CODE section from ROM: [";
    break;
  case 10:
    AnalyzerHelpers::GetNumberString(local_b0,display_base,0x30,local_98,0x80);
    AnalyzerResults::AddResultString
              ((char *)this,"ROM",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString((char *)this,"ROM: [",local_98,"]",(char *)0x0,(char *)0x0);
    pcVar1 = "ROM CODE section from ROM: [";
    break;
  case 0xb:
    AnalyzerResults::AddResultString
              ((char *)this,"D",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"DATA",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar1 = "DATA: [";
    break;
  case 0xc:
    AnalyzerResults::AddResultString
              ((char *)this,"Z",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"BIT",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar1 = "BIT - ERROR.";
LAB_00106e8a:
    AnalyzerResults::AddResultString
              ((char *)this,pcVar1,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    goto switchD_0010691e_default;
  case 0xd:
    AnalyzerResults::AddResultString
              ((char *)this,"COMMAND!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"INVALID ROM COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    pcVar1 = "Invalid ROM command: [";
    break;
  case 0xe:
    AnalyzerResults::AddResultString
              ((char *)this,"ALARM",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"ALARM SEARCH ROM COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    pcVar1 = "ALARM SEARCH ROM command: [";
    break;
  default:
    goto switchD_0010691e_default;
  }
  AnalyzerResults::AddResultString((char *)this,pcVar1,local_98,"]",(char *)0x0,(char *)0x0);
switchD_0010691e_default:
  Frame::~Frame(local_c0);
  return;
}

Assistant:

void OneWireAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& /*channel*/,
                                                 DisplayBase display_base ) // unrefereced vars commented out to remove warnings.
{
    Frame frame = GetFrame( frame_index );
    ClearResultStrings();

    bool warning_flag = false;
    if( ( frame.mFlags & DISPLAY_AS_WARNING_FLAG ) != 0 )
        warning_flag = true;


    // RestartPulse, PresencePulse, ReadRomFrame, SkipRomFrame, SearchRomFrame, AlarmSearchFrame, MatchRomFrame, OverdriveSkipRomFrame,
    // OverdriveMatchRomFrame, CRC, FamilyCode, Rom, Byte, Bit
    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

    switch( ( OneWireFrameType )frame.mType )
    {
    case RestartPulse:
    {
        if( warning_flag == false )
        {
            AddResultString( "R" );
            AddResultString( "RESET" );
            AddResultString( "RESET condition" );
        }
        else
        {
            AddResultString( "R!" );
            AddResultString( "RESET - WARNING" );
            AddResultString( "RESET - warning, too short." );
            AddResultString( "RESET - warning, pulse shorter than 480us" );
        }
    }
    break;
    case PresencePulse:
    {
        AddResultString( "P" );
        AddResultString( "PRESENCE" );
        AddResultString( "PRESENCE condition" );
    }
    break;
    case ReadRomFrame:
    {
        AddResultString( "READ" );
        AddResultString( "READ ROM COMMAND" );
        AddResultString( "READ ROM command: [", number_str, "]" );
    }
    break;
    case SkipRomFrame:
    {
        AddResultString( "SKIP" );
        AddResultString( "SKIP ROM COMMAND" );
        AddResultString( "SKIP ROM command: [", number_str, "]" );
    }
    break;
    case SearchRomFrame:
    {
        AddResultString( "SEARCH" );
        AddResultString( "SEARCH ROM COMMAND" );
        AddResultString( "SEARCH ROM command: [", number_str, "]" );
    }
    break;
    case AlarmSearchFrame:
    {
        AddResultString( "ALARM" );
        AddResultString( "ALARM SEARCH ROM COMMAND" );
        AddResultString( "ALARM SEARCH ROM command: [", number_str, "]" );
    }
    break;
    case MatchRomFrame:
    {
        AddResultString( "MATCH" );
        AddResultString( "MATCH ROM COMMAND" );
        AddResultString( "MATCH ROM command: [", number_str, "]" );
    }
    break;
    case OverdriveSkipRomFrame:
    {
        AddResultString( "OD SKIP" );
        AddResultString( "OVERDRIVE SKIP ROM" );
        AddResultString( "OVERDRIVE SKIP ROM command: [", number_str, "]" );
    }
    break;
    case OverdriveMatchRomFrame:
    {
        AddResultString( "OD MATCH" );
        AddResultString( "OVERDRIVE MATCH COMMAND" );
        AddResultString( "OVERDRIVE MATCH ROM command: [", number_str, "]" );
    }
    break;
    case CRC:
    {
        AddResultString( "CRC" );
        AddResultString( "CRC: [", number_str, "]" );
        AddResultString( "CRC section from ROM: [", number_str, "]" );
    }
    break;
    case FamilyCode:
    {
        AddResultString( "FAMILY" );
        AddResultString( "FAMILY: [", number_str, "]" );
        AddResultString( "FAMILY CODE section from ROM: [", number_str, "]" );
    }
    break;
    case Rom:
    {
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 48, number_str, 128 );
        AddResultString( "ROM" );
        AddResultString( "ROM: [", number_str, "]" );
        AddResultString( "ROM CODE section from ROM: [", number_str, "]" );
    }
    break;
    case Byte:
    {
        AddResultString( "D" );
        AddResultString( "DATA" );
        AddResultString( "DATA: [", number_str, "]" );
    }
    break;
    case Bit:
    {
        AddResultString( "Z" );
        AddResultString( "BIT" );
        AddResultString( "BIT - ERROR." );
    }
    break;
    case InvalidRomCommandFrame:
    {
        AddResultString( "COMMAND!" );
        AddResultString( "INVALID ROM COMMAND" );
        AddResultString( "Invalid ROM command: [", number_str, "]" );
    }
    break;
    }
}